

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O3

void __thiscall kiste::line_data_t::line_data_t(line_data_t *this,line_data_t *param_1)

{
  pointer pcVar1;
  
  this->_type = param_1->_type;
  std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
            (&this->_segments,&param_1->_segments);
  (this->_class_data)._name._M_dataplus._M_p = (pointer)&(this->_class_data)._name.field_2;
  pcVar1 = (param_1->_class_data)._name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_class_data,pcVar1,
             pcVar1 + (param_1->_class_data)._name._M_string_length);
  (this->_class_data)._parent_name._M_dataplus._M_p =
       (pointer)&(this->_class_data)._parent_name.field_2;
  pcVar1 = (param_1->_class_data)._parent_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_class_data)._parent_name,pcVar1,
             pcVar1 + (param_1->_class_data)._parent_name._M_string_length);
  (this->_member).class_name._M_dataplus._M_p = (pointer)&(this->_member).class_name.field_2;
  pcVar1 = (param_1->_member).class_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_member,pcVar1,pcVar1 + (param_1->_member).class_name._M_string_length
            );
  (this->_member).name._M_dataplus._M_p = (pointer)&(this->_member).name.field_2;
  pcVar1 = (param_1->_member).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_member).name,pcVar1,
             pcVar1 + (param_1->_member).name._M_string_length);
  return;
}

Assistant:

line_data_t(const line_data_t&) = default;